

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

Machine * setVariable(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  size_type *psVar1;
  uint uVar2;
  long lVar3;
  Hix HVar4;
  undefined8 uVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  Hcell h;
  key_type local_34 [2];
  Register r_local;
  
  uVar2 = (m->h).hix;
  psVar1 = &h.f_.id._M_string_length;
  h.f_.id._M_string_length._0_4_ = 0x62726167;
  h.f_.id._M_dataplus._M_p = (pointer)0x7;
  h.f_.id._M_string_length._4_4_ = 0x656761;
  h.f_.id.field_2._8_4_ = 0xffffffd6;
  h._0_8_ = psVar1;
  h.f_._32_8_ = __return_storage_ptr__;
  local_34[0].r = r.r;
  pmVar6 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&m->h);
  lVar3 = (ulong)uVar2 << 0x20;
  pmVar6->tag = (int)lVar3;
  pmVar6->hix_ = (Hix)(int)((ulong)lVar3 >> 0x20);
  std::__cxx11::string::operator=((string *)&pmVar6->f_,(string *)&h);
  (pmVar6->f_).arity = h.f_.id.field_2._8_4_;
  pmVar7 = std::
           map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
           ::operator[](&m->regval,local_34);
  HVar4.hix = (pmVar6->hix_).hix;
  pmVar7->tag = pmVar6->tag;
  pmVar7->hix_ = (Hix)HVar4.hix;
  std::__cxx11::string::_M_assign((string *)&pmVar7->f_);
  (pmVar7->f_).arity = (pmVar6->f_).arity;
  if ((size_type *)h._0_8_ != psVar1) {
    operator_delete((void *)h._0_8_,
                    CONCAT44(h.f_.id._M_string_length._4_4_,(undefined4)h.f_.id._M_string_length) +
                    1);
  }
  uVar5 = h.f_._32_8_;
  (m->h).hix = (m->h).hix + 1;
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(h.f_._32_8_ + 8),&(m->heap)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(uVar5 + 0x38),&(m->regval)._M_t._M_impl.super__Rb_tree_header);
  *(Mode *)(uVar5 + 0x68) = m->mode;
  *(undefined8 *)(uVar5 + 0x60) = *(undefined8 *)&m->h;
  return (Machine *)uVar5;
}

Assistant:

Machine setVariable(Machine m, Register r) {
    m.regval[r] = m.heap[m.h] = Hcell::ref(m.h);
    m.h += 1;
    return m;
}